

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

int Extra_ThreshSelectWeights(word *t,int nVars,int *pW)

{
  undefined1 local_29;
  int *pW_local;
  int nVars_local;
  word *t_local;
  
  if (nVars < 3) {
    local_29 = false;
    if ((*t & 0xf) != 6) {
      local_29 = (*t & 0xf) != 9;
    }
    t_local._4_4_ = (uint)local_29;
  }
  else if (nVars == 3) {
    t_local._4_4_ = Extra_ThreshSelectWeights3(t,3,pW);
  }
  else if (nVars == 4) {
    t_local._4_4_ = Extra_ThreshSelectWeights4(t,4,pW);
  }
  else if (nVars == 5) {
    t_local._4_4_ = Extra_ThreshSelectWeights5(t,5,pW);
  }
  else if (nVars == 6) {
    t_local._4_4_ = Extra_ThreshSelectWeights6(t,6,pW);
  }
  else if (nVars == 7) {
    t_local._4_4_ = Extra_ThreshSelectWeights7(t,7,pW);
  }
  else if (nVars == 8) {
    t_local._4_4_ = Extra_ThreshSelectWeights8(t,8,pW);
  }
  else {
    t_local._4_4_ = 0;
  }
  return t_local._4_4_;
}

Assistant:

int Extra_ThreshSelectWeights(word * t, int nVars, int * pW) {
	if (nVars <= 2)
		return (t[0] & 0xF) != 6 && (t[0] & 0xF) != 9;
	if (nVars == 3)
		return Extra_ThreshSelectWeights3(t, nVars, pW);
	if (nVars == 4)
		return Extra_ThreshSelectWeights4(t, nVars, pW);
	if (nVars == 5)
		return Extra_ThreshSelectWeights5(t, nVars, pW);
	if (nVars == 6)
		return Extra_ThreshSelectWeights6(t, nVars, pW);
	if (nVars == 7)
		return Extra_ThreshSelectWeights7(t, nVars, pW);
	if (nVars == 8)
		return Extra_ThreshSelectWeights8(t, nVars, pW);
	return 0;
}